

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_send(sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t selectorOperand,
                    size_t argumentCount,int16_t *argumentOperands,int applicationFlags)

{
  int32_t iVar1;
  void *value;
  sysbvm_x86_register_t reg;
  undefined6 in_register_00000032;
  long lVar2;
  uint8_t local_3f [4];
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  int local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT62(in_register_00000032,resultOperand);
  local_38 = applicationFlags;
  if (argumentCount != 0xffffffffffffffff) {
    lVar2 = 0;
    do {
      sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[lVar2],(int32_t)lVar2);
      lVar2 = lVar2 + 1;
    } while (argumentCount + 1 != lVar2);
  }
  iVar1 = jit->contextPointerOffset;
  local_3f[0] = 'H';
  local_3f[1] = 0x8b;
  local_3f[2] = 0xbd;
  local_3f[3] = (uint8_t)iVar1;
  local_3b = (undefined1)((uint)iVar1 >> 8);
  local_3a = (undefined1)((uint)iVar1 >> 0x10);
  local_39 = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_3f);
  value = sysbvm_chunkedAllocator_allocate(&(jit->context->heap).picTableAllocator,0x68,8);
  sysbvm_jit_x86_mov64Absolute(jit,SYSBVM_X86_64_ARG1,(uint64_t)value);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,selectorOperand);
  local_3f[0] = 'H';
  local_3f[1] = 199;
  local_3f[2] = 0xc1;
  local_3f[3] = (uint8_t)argumentCount;
  local_3b = (undefined1)(argumentCount >> 8);
  local_3a = (undefined1)(argumentCount >> 0x10);
  local_39 = (undefined1)(argumentCount >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_3f);
  iVar1 = jit->callArgumentVectorOffset;
  local_3f[0] = 'L';
  local_3f[1] = 0x8d;
  local_3f[2] = 0x85;
  local_3f[3] = (uint8_t)iVar1;
  local_3b = (undefined1)((uint)iVar1 >> 8);
  local_3a = (undefined1)((uint)iVar1 >> 0x10);
  local_39 = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_3f);
  local_3f[0] = 'I';
  local_3f[1] = 199;
  local_3f[2] = 0xc1;
  local_3f[3] = (uint8_t)local_38;
  local_3b = (undefined1)((uint)local_38 >> 8);
  local_3a = (undefined1)((uint)local_38 >> 0x10);
  local_39 = (undefined1)((uint)local_38 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_3f);
  sysbvm_jit_x86_call(jit,sysbvm_bytecodeInterpreter_interpretSendNoCopyArguments);
  sysbvm_jit_moveRegisterToOperand(jit,(int16_t)local_34,reg);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_send(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t selectorOperand, size_t argumentCount, int16_t *argumentOperands, int applicationFlags)
{
    // Move the arguments into the call vector.
    for(size_t i = 0; i < argumentCount + 1; ++i)
        sysbvm_jit_moveOperandToCallArgumentVector(jit, argumentOperands[i], (int32_t)i);

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);

    sysbvm_pic_t *pic = (sysbvm_pic_t*)sysbvm_chunkedAllocator_allocate(&jit->context->heap.picTableAllocator, sizeof(sysbvm_pic_t), sizeof(uintptr_t));
    sysbvm_jit_x86_mov64Absolute(jit, SYSBVM_X86_64_ARG1, (uint64_t)pic);

    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, selectorOperand);

    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG3, (int32_t)argumentCount);

#ifdef _WIN32
    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_RAX, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);
    sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 4*sizeof(void*), SYSBVM_X86_RAX);

    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 5*sizeof(void*), applicationFlags);
#else
    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_SYSV_ARG4, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);

    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_SYSV_ARG5, applicationFlags);
#endif
    sysbvm_jit_x86_call(jit, &sysbvm_bytecodeInterpreter_interpretSendNoCopyArguments);

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}